

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

bool comparesEqual(QString *s1,QString *s2)

{
  bool bVar1;
  QStringView *in_RSI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),&local_28)
  ;
  bVar1 = comparesEqual(in_RSI,(QStringView *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

friend bool comparesEqual(const QString &s1, const QString &s2) noexcept
    { return comparesEqual(QStringView(s1), QStringView(s2)); }